

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

QString * QMakeInternal::IoUtils::shellQuoteUnix(QString *__return_storage_ptr__,QString *arg)

{
  bool bVar1;
  qsizetype qVar2;
  storage_type *psVar3;
  QByteArrayView QVar4;
  
  if ((arg->d).size == 0) {
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("\'\'",3);
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar4);
  }
  else {
    (__return_storage_ptr__->d).size = -0x5555555555555556;
    (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&arg->d);
    bVar1 = hasSpecialChars(__return_storage_ptr__,&shellQuoteUnix::iqm);
    if (bVar1) {
      qVar2 = QtPrivate::lengthHelperPointer<char>("\'\\\'\'");
      QString::replace((QChar)(char16_t)__return_storage_ptr__,(QLatin1String *)0x27,
                       (CaseSensitivity)qVar2);
      QString::prepend(__return_storage_ptr__,(QChar)0x27);
      QString::append((QChar)(char16_t)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString IoUtils::shellQuoteUnix(const QString &arg)
{
    // Chars that should be quoted (TM). This includes:
    static const uchar iqm[] = {
        0xff, 0xff, 0xff, 0xff, 0xdf, 0x07, 0x00, 0xd8,
        0x00, 0x00, 0x00, 0x38, 0x01, 0x00, 0x00, 0x78
    }; // 0-32 \'"$`<>|;&(){}*?#!~[]

    if (!arg.size())
        return QString::fromLatin1("''");

    QString ret(arg);
    if (hasSpecialChars(ret, iqm)) {
        ret.replace(QLatin1Char('\''), QLatin1String("'\\''"));
        ret.prepend(QLatin1Char('\''));
        ret.append(QLatin1Char('\''));
    }
    return ret;
}